

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

MPP_RET decode_poc(H264dVideoCtx_t *p_Vid,H264_SLICE_t *pSlice)

{
  RK_S32 RVar1;
  h264_sps_t *phVar2;
  uint uVar3;
  int iVar4;
  RK_S32 local_44;
  RK_S32 local_40;
  H264_SPS_t *active_sps;
  MPP_RET ret;
  RK_U32 MaxPicOrderCntLsb;
  RK_S32 i;
  H264_SLICE_t *pSlice_local;
  H264dVideoCtx_t *p_Vid_local;
  
  phVar2 = p_Vid->active_sps;
  uVar3 = 1 << ((char)phVar2->log2_max_pic_order_cnt_lsb_minus4 + 4U & 0x1f);
  iVar4 = phVar2->pic_order_cnt_type;
  if (iVar4 == 0) {
    if (pSlice->idr_flag == 0) {
      if (p_Vid->last_has_mmco_5 != 0) {
        if (p_Vid->last_pic_bottom_field == 0) {
          p_Vid->PrevPicOrderCntMsb = 0;
          p_Vid->PrevPicOrderCntLsb = pSlice->toppoc;
        }
        else {
          p_Vid->PrevPicOrderCntMsb = 0;
          p_Vid->PrevPicOrderCntLsb = 0;
        }
      }
    }
    else {
      p_Vid->PrevPicOrderCntMsb = 0;
      p_Vid->PrevPicOrderCntLsb = 0;
    }
    if ((pSlice->pic_order_cnt_lsb < p_Vid->PrevPicOrderCntLsb) &&
       ((int)(uVar3 >> 1) <= p_Vid->PrevPicOrderCntLsb - pSlice->pic_order_cnt_lsb)) {
      pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb + uVar3;
    }
    else if ((p_Vid->PrevPicOrderCntLsb < pSlice->pic_order_cnt_lsb) &&
            ((int)(uVar3 >> 1) < pSlice->pic_order_cnt_lsb - p_Vid->PrevPicOrderCntLsb)) {
      pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb - uVar3;
    }
    else {
      pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb;
    }
    if (pSlice->field_pic_flag == 0) {
      pSlice->toppoc = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
      pSlice->bottompoc = pSlice->toppoc + pSlice->delta_pic_order_cnt_bottom;
      if (pSlice->toppoc < pSlice->bottompoc) {
        local_40 = pSlice->toppoc;
      }
      else {
        local_40 = pSlice->bottompoc;
      }
      pSlice->framepoc = local_40;
      pSlice->ThisPOC = local_40;
    }
    else if (pSlice->bottom_field_flag == 0) {
      iVar4 = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
      pSlice->toppoc = iVar4;
      pSlice->ThisPOC = iVar4;
    }
    else {
      iVar4 = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
      pSlice->bottompoc = iVar4;
      pSlice->ThisPOC = iVar4;
    }
    pSlice->framepoc = pSlice->ThisPOC;
    p_Vid->ThisPOC = pSlice->ThisPOC;
    p_Vid->PreviousFrameNum = pSlice->frame_num;
    if (pSlice->nal_reference_idc != 0) {
      p_Vid->PrevPicOrderCntLsb = pSlice->pic_order_cnt_lsb;
      p_Vid->PrevPicOrderCntMsb = pSlice->PicOrderCntMsb;
    }
  }
  else if (iVar4 == 1) {
    if (pSlice->idr_flag == 0) {
      if (p_Vid->last_has_mmco_5 != 0) {
        p_Vid->PreviousFrameNumOffset = 0;
        p_Vid->PreviousFrameNum = 0;
      }
      if (pSlice->frame_num < (int)p_Vid->PreviousFrameNum) {
        p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset + p_Vid->max_frame_num;
      }
      else {
        p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset;
      }
    }
    else {
      p_Vid->FrameNumOffset = 0;
      if (pSlice->frame_num != 0) {
        if ((h264d_debug & 4) == 0) {
          return MPP_ERR_VALUE;
        }
        _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0x62);
        return MPP_ERR_VALUE;
      }
    }
    if (phVar2->num_ref_frames_in_pic_order_cnt_cycle == 0) {
      pSlice->AbsFrameNum = 0;
    }
    else {
      pSlice->AbsFrameNum = p_Vid->FrameNumOffset + pSlice->frame_num;
    }
    if ((pSlice->nal_reference_idc == 0) && (pSlice->AbsFrameNum != 0)) {
      pSlice->AbsFrameNum = pSlice->AbsFrameNum - 1;
    }
    p_Vid->ExpectedDeltaPerPicOrderCntCycle = 0;
    if (phVar2->num_ref_frames_in_pic_order_cnt_cycle != 0) {
      for (ret = MPP_OK; ret < phVar2->num_ref_frames_in_pic_order_cnt_cycle;
          ret = ret + ~MPP_ERR_UNKNOW) {
        p_Vid->ExpectedDeltaPerPicOrderCntCycle =
             phVar2->offset_for_ref_frame[ret] + p_Vid->ExpectedDeltaPerPicOrderCntCycle;
      }
    }
    if (pSlice->AbsFrameNum == 0) {
      p_Vid->ExpectedPicOrderCnt = 0;
    }
    else {
      p_Vid->PicOrderCntCycleCnt =
           (pSlice->AbsFrameNum - 1) / (uint)phVar2->num_ref_frames_in_pic_order_cnt_cycle;
      p_Vid->FrameNumInPicOrderCntCycle =
           (pSlice->AbsFrameNum - 1) % (uint)phVar2->num_ref_frames_in_pic_order_cnt_cycle;
      p_Vid->ExpectedPicOrderCnt =
           p_Vid->PicOrderCntCycleCnt * p_Vid->ExpectedDeltaPerPicOrderCntCycle;
      for (ret = MPP_OK; ret <= p_Vid->FrameNumInPicOrderCntCycle; ret = ret + ~MPP_ERR_UNKNOW) {
        p_Vid->ExpectedPicOrderCnt = phVar2->offset_for_ref_frame[ret] + p_Vid->ExpectedPicOrderCnt;
      }
    }
    if (pSlice->nal_reference_idc == 0) {
      p_Vid->ExpectedPicOrderCnt = phVar2->offset_for_non_ref_pic + p_Vid->ExpectedPicOrderCnt;
    }
    if (pSlice->field_pic_flag == 0) {
      pSlice->toppoc = p_Vid->ExpectedPicOrderCnt + pSlice->delta_pic_order_cnt[0];
      pSlice->bottompoc =
           pSlice->toppoc + phVar2->offset_for_top_to_bottom_field + pSlice->delta_pic_order_cnt[1];
      if (pSlice->toppoc < pSlice->bottompoc) {
        local_44 = pSlice->toppoc;
      }
      else {
        local_44 = pSlice->bottompoc;
      }
      pSlice->framepoc = local_44;
      pSlice->ThisPOC = local_44;
    }
    else if (pSlice->bottom_field_flag == 0) {
      iVar4 = p_Vid->ExpectedPicOrderCnt + pSlice->delta_pic_order_cnt[0];
      pSlice->toppoc = iVar4;
      pSlice->ThisPOC = iVar4;
    }
    else {
      iVar4 = p_Vid->ExpectedPicOrderCnt + phVar2->offset_for_top_to_bottom_field +
              pSlice->delta_pic_order_cnt[0];
      pSlice->bottompoc = iVar4;
      pSlice->ThisPOC = iVar4;
    }
    pSlice->framepoc = pSlice->ThisPOC;
    p_Vid->PreviousFrameNum = pSlice->frame_num;
    p_Vid->PreviousFrameNumOffset = p_Vid->FrameNumOffset;
  }
  else {
    if (iVar4 != 2) {
      return MPP_NOK;
    }
    if (pSlice->idr_flag == 0) {
      if (p_Vid->last_has_mmco_5 != 0) {
        p_Vid->PreviousFrameNum = 0;
        p_Vid->PreviousFrameNumOffset = 0;
      }
      if (pSlice->frame_num < (int)p_Vid->PreviousFrameNum) {
        p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset + p_Vid->max_frame_num;
      }
      else {
        p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset;
      }
      pSlice->AbsFrameNum = p_Vid->FrameNumOffset + pSlice->frame_num;
      if (pSlice->nal_reference_idc == 0) {
        pSlice->ThisPOC = pSlice->AbsFrameNum * 2 + -1;
      }
      else {
        pSlice->ThisPOC = pSlice->AbsFrameNum << 1;
      }
      if (pSlice->field_pic_flag == 0) {
        RVar1 = pSlice->ThisPOC;
        pSlice->framepoc = RVar1;
        pSlice->bottompoc = RVar1;
        pSlice->toppoc = RVar1;
      }
      else if (pSlice->bottom_field_flag == 0) {
        pSlice->framepoc = pSlice->ThisPOC;
        pSlice->toppoc = pSlice->ThisPOC;
      }
      else {
        pSlice->framepoc = pSlice->ThisPOC;
        pSlice->bottompoc = pSlice->ThisPOC;
      }
    }
    else {
      p_Vid->FrameNumOffset = 0;
      pSlice->bottompoc = 0;
      pSlice->toppoc = 0;
      pSlice->framepoc = 0;
      pSlice->ThisPOC = 0;
      if (pSlice->frame_num != 0) {
        if ((h264d_debug & 4) == 0) {
          return MPP_ERR_VALUE;
        }
        _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0xa1);
        return MPP_ERR_VALUE;
      }
    }
    p_Vid->PreviousFrameNum = pSlice->frame_num;
    p_Vid->PreviousFrameNumOffset = p_Vid->FrameNumOffset;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET decode_poc(H264dVideoCtx_t *p_Vid, H264_SLICE_t *pSlice)
{
    RK_S32 i = 0;
    RK_U32 MaxPicOrderCntLsb = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SPS_t *active_sps = p_Vid->active_sps;
    // for POC mode 0:
    MaxPicOrderCntLsb = (1 << (active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4));

    switch (active_sps->pic_order_cnt_type) {
    case 0: // POC MODE 0
        // 1st
        if (pSlice->idr_flag) {
            p_Vid->PrevPicOrderCntMsb = 0;
            p_Vid->PrevPicOrderCntLsb = 0;
        } else {
            if (p_Vid->last_has_mmco_5) {
                if (p_Vid->last_pic_bottom_field) {
                    p_Vid->PrevPicOrderCntMsb = 0;
                    p_Vid->PrevPicOrderCntLsb = 0;
                } else {
                    p_Vid->PrevPicOrderCntMsb = 0;
                    p_Vid->PrevPicOrderCntLsb = pSlice->toppoc;
                }
            }
        }
        // Calculate the MSBs of current picture
        if (pSlice->pic_order_cnt_lsb  <  p_Vid->PrevPicOrderCntLsb &&
            (p_Vid->PrevPicOrderCntLsb - pSlice->pic_order_cnt_lsb) >= (RK_S32)(MaxPicOrderCntLsb / 2)) {
            pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb + MaxPicOrderCntLsb;
        } else if (pSlice->pic_order_cnt_lsb  >  p_Vid->PrevPicOrderCntLsb &&
                   (pSlice->pic_order_cnt_lsb - p_Vid->PrevPicOrderCntLsb) > (RK_S32)(MaxPicOrderCntLsb / 2)) {
            pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb - MaxPicOrderCntLsb;
        } else {
            pSlice->PicOrderCntMsb = p_Vid->PrevPicOrderCntMsb;
        }
        // 2nd
        if (pSlice->field_pic_flag == 0) {
            //frame pix
            pSlice->toppoc = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
            pSlice->bottompoc = pSlice->toppoc + pSlice->delta_pic_order_cnt_bottom;
            pSlice->ThisPOC = pSlice->framepoc = (pSlice->toppoc < pSlice->bottompoc) ? pSlice->toppoc : pSlice->bottompoc; // POC200301
        } else if (pSlice->bottom_field_flag == 0) {
            //top field
            pSlice->ThisPOC = pSlice->toppoc = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
        } else {
            //bottom field
            pSlice->ThisPOC = pSlice->bottompoc = pSlice->PicOrderCntMsb + pSlice->pic_order_cnt_lsb;
        }
        pSlice->framepoc = pSlice->ThisPOC;
        p_Vid->ThisPOC = pSlice->ThisPOC;
        //if ( pSlice->frame_num != p_Vid->PreviousFrameNum) //Seems redundant
        p_Vid->PreviousFrameNum = pSlice->frame_num;
        if (pSlice->nal_reference_idc) {
            p_Vid->PrevPicOrderCntLsb = pSlice->pic_order_cnt_lsb;
            p_Vid->PrevPicOrderCntMsb = pSlice->PicOrderCntMsb;
        }
        break;

    case 1: // POC MODE 1
        // 1st
        if (pSlice->idr_flag) {
            p_Vid->FrameNumOffset = 0;     //  first pix of IDRGOP,
            VAL_CHECK(ret, 0 == pSlice->frame_num);
        } else {
            if (p_Vid->last_has_mmco_5) {
                p_Vid->PreviousFrameNumOffset = 0;
                p_Vid->PreviousFrameNum = 0;
            }
            if (pSlice->frame_num < (RK_S32)p_Vid->PreviousFrameNum) {
                //not first pix of IDRGOP
                p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset + p_Vid->max_frame_num;
            } else {
                p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset;
            }
        }
        // 2nd
        if (active_sps->num_ref_frames_in_pic_order_cnt_cycle) {
            pSlice->AbsFrameNum = p_Vid->FrameNumOffset + pSlice->frame_num;
        } else {
            pSlice->AbsFrameNum = 0;
        }
        if ((!pSlice->nal_reference_idc) && pSlice->AbsFrameNum > 0) {
            pSlice->AbsFrameNum--;
        }
        // 3rd
        p_Vid->ExpectedDeltaPerPicOrderCntCycle = 0;
        if (active_sps->num_ref_frames_in_pic_order_cnt_cycle) {
            for (i = 0; i < (RK_S32)active_sps->num_ref_frames_in_pic_order_cnt_cycle; i++) {
                p_Vid->ExpectedDeltaPerPicOrderCntCycle += active_sps->offset_for_ref_frame[i];
            }
        }
        if (pSlice->AbsFrameNum) {
            p_Vid->PicOrderCntCycleCnt = (pSlice->AbsFrameNum - 1) / active_sps->num_ref_frames_in_pic_order_cnt_cycle;
            p_Vid->FrameNumInPicOrderCntCycle = (pSlice->AbsFrameNum - 1) % active_sps->num_ref_frames_in_pic_order_cnt_cycle;
            p_Vid->ExpectedPicOrderCnt = p_Vid->PicOrderCntCycleCnt * p_Vid->ExpectedDeltaPerPicOrderCntCycle;
            for (i = 0; i <= (RK_S32)p_Vid->FrameNumInPicOrderCntCycle; i++)
                p_Vid->ExpectedPicOrderCnt += active_sps->offset_for_ref_frame[i];
        } else {
            p_Vid->ExpectedPicOrderCnt = 0;
        }
        if (!pSlice->nal_reference_idc) {
            p_Vid->ExpectedPicOrderCnt += active_sps->offset_for_non_ref_pic;
        }
        if (pSlice->field_pic_flag == 0) {
            //frame pix
            pSlice->toppoc = p_Vid->ExpectedPicOrderCnt + pSlice->delta_pic_order_cnt[0];
            pSlice->bottompoc = pSlice->toppoc + active_sps->offset_for_top_to_bottom_field + pSlice->delta_pic_order_cnt[1];
            pSlice->ThisPOC = pSlice->framepoc = (pSlice->toppoc < pSlice->bottompoc) ? pSlice->toppoc : pSlice->bottompoc; // POC200301
        } else if (pSlice->bottom_field_flag == 0) {
            //top field
            pSlice->ThisPOC = pSlice->toppoc = p_Vid->ExpectedPicOrderCnt + pSlice->delta_pic_order_cnt[0];
        } else {
            //bottom field
            pSlice->ThisPOC = pSlice->bottompoc = p_Vid->ExpectedPicOrderCnt + active_sps->offset_for_top_to_bottom_field + pSlice->delta_pic_order_cnt[0];
        }
        pSlice->framepoc = pSlice->ThisPOC;
        p_Vid->PreviousFrameNum = pSlice->frame_num;
        p_Vid->PreviousFrameNumOffset = p_Vid->FrameNumOffset;
        break;


    case 2: // POC MODE 2
        if (pSlice->idr_flag) { // IDR picture
            p_Vid->FrameNumOffset = 0;     //  first pix of IDRGOP,
            pSlice->ThisPOC = pSlice->framepoc = pSlice->toppoc = pSlice->bottompoc = 0;
            VAL_CHECK(ret, 0 == pSlice->frame_num);
        } else {
            if (p_Vid->last_has_mmco_5) {
                p_Vid->PreviousFrameNum = 0;
                p_Vid->PreviousFrameNumOffset = 0;
            }
            if (pSlice->frame_num < (RK_S32)p_Vid->PreviousFrameNum) {
                p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset + p_Vid->max_frame_num;
            } else {
                p_Vid->FrameNumOffset = p_Vid->PreviousFrameNumOffset;
            }
            pSlice->AbsFrameNum = p_Vid->FrameNumOffset + pSlice->frame_num;
            if (!pSlice->nal_reference_idc) {
                pSlice->ThisPOC = (2 * pSlice->AbsFrameNum - 1);
            } else {
                pSlice->ThisPOC = (2 * pSlice->AbsFrameNum);
            }
            if (pSlice->field_pic_flag == 0) {
                pSlice->toppoc = pSlice->bottompoc = pSlice->framepoc = pSlice->ThisPOC;
            } else if (pSlice->bottom_field_flag == 0) {
                pSlice->toppoc = pSlice->framepoc = pSlice->ThisPOC;
            } else {
                pSlice->bottompoc = pSlice->framepoc = pSlice->ThisPOC;
            }
        }
        p_Vid->PreviousFrameNum = pSlice->frame_num;
        p_Vid->PreviousFrameNumOffset = p_Vid->FrameNumOffset;
        break;
    default:
        ret = MPP_NOK;
        goto __FAILED;
    }
    return ret = MPP_OK;

__FAILED:
    return ret;
}